

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivFixOutputPairs(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  int i;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManPoNum(p);
  if ((uVar1 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x339,"void Gia_ManEquivFixOutputPairs(Gia_Man_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar5 = false;
    if (local_24 < iVar2) {
      pObj1 = Gia_ManCo(p,local_24);
      bVar5 = pObj1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pObj = Gia_ManPo(p,local_24 + 1);
    pGVar3 = Gia_ObjChild0(pObj1);
    pGVar4 = Gia_ObjChild0(pObj);
    if (pGVar3 == pGVar4) {
      uVar1 = Gia_ObjId(p,pObj1);
      *(ulong *)pObj1 = *(ulong *)pObj1 & 0xffffffffe0000000 | (ulong)uVar1 & 0x1fffffff;
      *(ulong *)pObj1 = *(ulong *)pObj1 & 0xffffffffdfffffff;
      uVar1 = Gia_ObjId(p,pObj);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)uVar1 & 0x1fffffff;
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff;
    }
    local_24 = local_24 + 2;
  }
  return;
}

Assistant:

void Gia_ManEquivFixOutputPairs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj0, * pObj1;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ManForEachPo( p, pObj0, i )
    {
        pObj1 = Gia_ManPo( p, ++i );
        if ( Gia_ObjChild0(pObj0) != Gia_ObjChild0(pObj1) )
            continue;
        pObj0->iDiff0  = Gia_ObjId(p, pObj0);
        pObj0->fCompl0 = 0;
        pObj1->iDiff0  = Gia_ObjId(p, pObj1);
        pObj1->fCompl0 = 0;
    }
}